

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

CURLcode cpool_add_pollfds(cpool *cpool,curl_pollfds *cpfds)

{
  CURLcode CVar1;
  Curl_llist_node *pCVar2;
  connectdata *conn;
  easy_pollset ps;
  easy_pollset local_48;
  
  pCVar2 = Curl_llist_head(&cpool->shutdowns);
  if (pCVar2 != (Curl_llist_node *)0x0) {
    for (pCVar2 = Curl_llist_head(&cpool->shutdowns); pCVar2 != (Curl_llist_node *)0x0;
        pCVar2 = Curl_node_next(pCVar2)) {
      conn = (connectdata *)Curl_node_elem(pCVar2);
      local_48.sockets[0] = 0;
      local_48.sockets[1] = 0;
      local_48.sockets[2] = 0;
      local_48.sockets[3] = 0;
      local_48.sockets[4] = 0;
      local_48.num = 0;
      local_48.actions[0] = '\0';
      local_48.actions[1] = '\0';
      local_48.actions[2] = '\0';
      local_48.actions[3] = '\0';
      local_48.actions[4] = '\0';
      local_48._29_3_ = 0;
      Curl_attach_connection(cpool->idata,conn);
      Curl_conn_adjust_pollset(cpool->idata,&local_48);
      Curl_detach_connection(cpool->idata);
      CVar1 = Curl_pollfds_add_ps(cpfds,&local_48);
      if (CVar1 != CURLE_OK) {
        Curl_pollfds_cleanup(cpfds);
        return CVar1;
      }
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cpool_add_pollfds(struct cpool *cpool,
                                  struct curl_pollfds *cpfds)
{
  CURLcode result = CURLE_OK;

  if(Curl_llist_head(&cpool->shutdowns)) {
    struct Curl_llist_node *e;
    struct easy_pollset ps;
    struct connectdata *conn;

    for(e = Curl_llist_head(&cpool->shutdowns); e;
        e = Curl_node_next(e)) {
      conn = Curl_node_elem(e);
      memset(&ps, 0, sizeof(ps));
      Curl_attach_connection(cpool->idata, conn);
      Curl_conn_adjust_pollset(cpool->idata, &ps);
      Curl_detach_connection(cpool->idata);

      result = Curl_pollfds_add_ps(cpfds, &ps);
      if(result) {
        Curl_pollfds_cleanup(cpfds);
        goto out;
      }
    }
  }
out:
  return result;
}